

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

Rpo_TtStore_t * Abc_TtStoreLoad(char *pFileName,int nVarNum)

{
  uint uVar1;
  uint uVar2;
  word *pBuffer_00;
  int nTruths_1;
  int nBytes;
  int nFileSize;
  char *pBuffer;
  int nTruths;
  int nVars;
  Rpo_TtStore_t *p;
  char *pcStack_18;
  int nVarNum_local;
  char *pFileName_local;
  
  p._4_4_ = nVarNum;
  pcStack_18 = pFileName;
  if (nVarNum < 0) {
    Abc_TruthGetParams(pFileName,(int *)((long)&pBuffer + 4),(int *)&pBuffer);
    if (((pBuffer._4_4_ < 2) || (0x10 < pBuffer._4_4_)) || ((int)pBuffer == 0)) {
      return (Rpo_TtStore_t *)0x0;
    }
    _nTruths = Abc_TruthStoreAlloc(pBuffer._4_4_,(int)pBuffer);
    Abc_TruthStoreRead(pcStack_18,_nTruths);
  }
  else {
    uVar1 = Abc_FileSize(pFileName);
    uVar2 = 1 << ((char)p._4_4_ - 3U & 0x1f);
    if (uVar1 == 0xffffffff) {
      return (Rpo_TtStore_t *)0x0;
    }
    if (p._4_4_ < 6) {
      __assert_fail("nVarNum >= 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRpo.c"
                    ,0x141,"Rpo_TtStore_t *Abc_TtStoreLoad(char *, int)");
    }
    if ((int)uVar1 % (int)uVar2 != 0) {
      Abc_Print(0,
                "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n",
                (ulong)uVar1,(ulong)uVar2,(long)(int)uVar1 % (long)(int)uVar2 & 0xffffffff);
    }
    pBuffer_00 = (word *)Abc_FileRead(pcStack_18);
    _nTruths = Abc_TruthStoreAlloc2(p._4_4_,(int)uVar1 / (int)uVar2,pBuffer_00);
  }
  return _nTruths;
}

Assistant:

Abc_TtStore_t * Abc_TtStoreLoad( char * pFileName, int nVarNum )
{ 
    Abc_TtStore_t * p;
    if ( nVarNum < 0 )
    {
        int nVars, nTruths;
        // figure out how many truth table and how many variables
        Abc_TruthGetParams( pFileName, &nVars, &nTruths );
        if ( nVars < 2 || nVars > 16 || nTruths == 0 )
            return NULL;
        // allocate data-structure
        p = Abc_TruthStoreAlloc( nVars, nTruths );
        // read info from file
        Abc_TruthStoreRead( pFileName, p );
    }
    else
    { 
        char * pBuffer;
        int nFileSize = Abc_FileSize( pFileName );
        int nBytes = (1 << (nVarNum-3));
        int nTruths = nFileSize / nBytes;
        if ( nFileSize == -1 )
            return NULL;
        assert( nVarNum >= 6 );
        if ( nFileSize % nBytes != 0 ) 
            Abc_Print( 0, "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n", 
                nFileSize, nBytes, nFileSize % nBytes );
        // read file contents
        pBuffer = Abc_FileRead( pFileName );
        // allocate data-structure
        p = Abc_TruthStoreAlloc2( nVarNum, nTruths, (word *)pBuffer );
    }
    return p;
}